

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* json_parse(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *__return_storage_ptr__,string *fname)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long *__nptr;
  int iVar3;
  int *piVar4;
  long lVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  int iVar8;
  char *pcVar9;
  char cVar10;
  bool bVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  ulong uVar15;
  string str_val;
  string json;
  ifstream ifs;
  string local_2e0;
  string local_2c0;
  long *local_2a0;
  char *local_298;
  long local_290 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_280;
  string local_278;
  char *local_258;
  undefined8 local_250;
  char local_248;
  undefined7 uStack_247;
  string local_238;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258 = &local_248;
  local_250 = 0;
  local_248 = '\0';
  local_280 = &__return_storage_ptr__->_M_t;
  std::ifstream::ifstream(&local_238,(string *)fname,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    json_parse();
    uVar7 = extraout_RAX;
LAB_0010dbed:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(local_280);
    _Unwind_Resume(uVar7);
  }
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_2a0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238._M_dataplus._M_p + -0x18)),
             0xffffffff,0,0xffffffff);
  std::__cxx11::string::operator=((string *)&local_258,(string *)&local_2a0);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  std::ifstream::~ifstream(&local_238);
  if (*local_258 == '{') {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
    iVar3 = (int)local_250;
    if (1 < (int)local_250) {
      bVar11 = false;
      uVar15 = 1;
      bVar2 = false;
      do {
        uVar14 = (uint)uVar15;
        cVar10 = local_258[(int)uVar14];
        if (bVar11) {
          if (cVar10 == '\"') {
            if (!bVar2) {
              iVar8 = uVar14 + 1;
              pcVar9 = local_258 + (int)uVar14;
              do {
                pcVar9 = pcVar9 + 1;
                iVar8 = iVar8 + 1;
              } while (*pcVar9 == ' ');
              for (uVar15 = (ulong)iVar8; local_258[uVar15] == ' '; uVar15 = uVar15 + 1) {
              }
              if (local_258[uVar15] == '\"') {
                bVar2 = true;
                bVar11 = true;
                goto LAB_0010dae0;
              }
              for (; (local_258[uVar15] != ',' && (local_258[uVar15] != '}')); uVar15 = uVar15 + 1)
              {
                std::__cxx11::string::push_back((char)&local_2a0);
              }
            }
            paVar13 = &local_2e0.field_2;
            paVar12 = &local_2c0.field_2;
            local_2e0._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\u0120","");
            local_2c0._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0," ","");
            replace(&local_278,&local_238,&local_2e0,&local_2c0);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != paVar12) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != paVar13) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2e0._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\u010a","");
            local_2c0._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"\n","");
            replace(&local_278,&local_238,&local_2e0,&local_2c0);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != paVar12) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != paVar13) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2e0._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\\\"","");
            local_2c0._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"\"","");
            replace(&local_278,&local_238,&local_2e0,&local_2c0);
            std::__cxx11::string::operator=((string *)&local_238,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != paVar12) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != paVar13) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            __nptr = local_2a0;
            piVar4 = __errno_location();
            iVar8 = *piVar4;
            *piVar4 = 0;
            lVar5 = strtol((char *)__nptr,(char **)&local_278,10);
            if ((long *)local_278._M_dataplus._M_p == __nptr) {
              uVar7 = std::__throw_invalid_argument("stoi");
              goto LAB_0010dbed;
            }
            if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) {
              uVar7 = std::__throw_out_of_range("stoi");
              goto LAB_0010dbed;
            }
            if (*piVar4 == 0) {
              *piVar4 = iVar8;
            }
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_280,&local_238);
            *pmVar6 = (int)lVar5;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_238,0,(char *)local_238._M_string_length,0x121256);
            bVar2 = false;
            std::__cxx11::string::_M_replace((ulong)&local_2a0,0,local_298,0x121256);
            bVar11 = false;
          }
          else {
            if ((cVar10 == '\\') && ((int)(uVar14 + 1) < iVar3)) {
              cVar10 = (char)&local_2a0;
              if (!bVar2) {
                cVar10 = (char)&local_238;
              }
              std::__cxx11::string::push_back(cVar10);
              uVar14 = uVar14 + 1;
            }
            cVar10 = (char)&local_2a0;
            if (!bVar2) {
              cVar10 = (char)&local_238;
            }
            std::__cxx11::string::push_back(cVar10);
            uVar15 = (ulong)uVar14;
          }
        }
        else if ((cVar10 != ' ') && (cVar10 == '\"')) {
          bVar11 = true;
        }
LAB_0010dae0:
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
      } while ((int)uVar14 < iVar3);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_280;
}

Assistant:

std::map<std::string, int32_t> json_parse(const std::string & fname) {
    std::map<std::string, int32_t> result;

    // read file into string
    std::string json;
    {
        std::ifstream ifs(fname);
        if (!ifs) {
            fprintf(stderr, "Failed to open %s\n", fname.c_str());
            exit(1);
        }

        json = std::string((std::istreambuf_iterator<char>(ifs)),
                (std::istreambuf_iterator<char>()));
    }

    if (json[0] != '{') {
        return result;
    }

    // parse json
    {
        bool has_key  = false;
        bool in_token = false;

        std::string str_key = "";
        std::string str_val = "";

        int n = json.size();
        for (int i = 1; i < n; ++i) {
            if (!in_token) {
                if (json[i] == ' ') continue;
                if (json[i] == '"') {
                    in_token = true;
                    continue;
                }
            } else {
                if (json[i] == '\\' && i+1 < n) {
                    if (has_key == false) {
                        str_key += json[i];
                    } else {
                        str_val += json[i];
                    }
                    ++i;
                } else if (json[i] == '"') {
                    if (has_key == false) {
                        has_key = true;
                        ++i;
                        while (json[i] == ' ') ++i;
                        ++i; // :
                        while (json[i] == ' ') ++i;
                        if (json[i] != '\"') {
                            while (json[i] != ',' && json[i] != '}') {
                                str_val += json[i++];
                            }
                            has_key = false;
                        } else {
                            in_token = true;
                            continue;
                        }
                    } else {
                        has_key = false;
                    }

                    str_key = ::replace(str_key, "\\u0120", " " ); // \u0120 -> space
                    str_key = ::replace(str_key, "\\u010a", "\n"); // \u010a -> new line
                    str_key = ::replace(str_key, "\\\"",    "\""); // \\\"   -> "

                    try {
                        result[str_key] = std::stoi(str_val);
                    } catch (...) {
                        //fprintf(stderr, "%s: ignoring key '%s' with value '%s'\n", fname.c_str(), str_key.c_str(), str_val.c_str());

                    }
                    str_key = "";
                    str_val = "";
                    in_token = false;
                    continue;
                }
                if (has_key == false) {
                    str_key += json[i];
                } else {
                    str_val += json[i];
                }
            }
        }
    }

    return result;
}